

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_key.cpp
# Opt level: O1

int CfdAddCombinePubkey(void *handle,void *combine_handle,char *pubkey)

{
  pointer pcVar1;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *this;
  bool bVar2;
  CfdException *pCVar3;
  Pubkey key;
  allocator local_69;
  undefined1 local_68 [32];
  Pubkey local_48;
  
  cfd::Initialize();
  pcVar1 = local_68 + 0x10;
  local_68._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"CombinePubkey","");
  cfd::capi::CheckBuffer(combine_handle,(string *)local_68);
  if ((pointer)local_68._0_8_ != pcVar1) {
    operator_delete((void *)local_68._0_8_);
  }
  bVar2 = cfd::capi::IsEmptyString(pubkey);
  if (!bVar2) {
    if (*(long *)((long)combine_handle + 0x10) != 0) {
      std::__cxx11::string::string((string *)local_68,pubkey,&local_69);
      cfd::core::Pubkey::Pubkey(&local_48,(string *)local_68);
      if ((pointer)local_68._0_8_ != pcVar1) {
        operator_delete((void *)local_68._0_8_);
      }
      this = *(vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> **)
              ((long)combine_handle + 0x10);
      cfd::core::Pubkey::GetHex_abi_cxx11_((string *)local_68,&local_48);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                (this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68)
      ;
      if ((pointer)local_68._0_8_ != pcVar1) {
        operator_delete((void *)local_68._0_8_);
      }
      if (local_48.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_48.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      return 0;
    }
    local_68._0_8_ = "cfdcapi_key.cpp";
    local_68._8_4_ = 0x54c;
    local_68._16_8_ = "CfdAddCombinePubkey";
    cfd::core::logger::log<>
              ((CfdSourceLocation *)local_68,kCfdLogLevelWarning,"pubkey_list is null.");
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    local_68._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_68,"Failed to parameter. pubkey_list is null.","");
    cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalStateError,(string *)local_68);
    __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  local_68._0_8_ = "cfdcapi_key.cpp";
  local_68._8_4_ = 0x543;
  local_68._16_8_ = "CfdAddCombinePubkey";
  cfd::core::logger::log<>
            ((CfdSourceLocation *)local_68,kCfdLogLevelWarning,"pubkey is null or empty.");
  pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
  local_68._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_68,"Failed to parameter. pubkey is null or empty.","");
  cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)local_68);
  __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdAddCombinePubkey(
    void* handle, void* combine_handle, const char* pubkey) {
  try {
    cfd::Initialize();
    CheckBuffer(combine_handle, kPrefixCombinePubkey);
    if (IsEmptyString(pubkey)) {
      warn(CFD_LOG_SOURCE, "pubkey is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. pubkey is null or empty.");
    }

    CfdCapiCombinePubkey* buffer =
        static_cast<CfdCapiCombinePubkey*>(combine_handle);
    if (buffer->pubkey_list == nullptr) {
      warn(CFD_LOG_SOURCE, "pubkey_list is null.");
      throw CfdException(
          CfdError::kCfdIllegalStateError,
          "Failed to parameter. pubkey_list is null.");
    }
    Pubkey key(pubkey);
    buffer->pubkey_list->push_back(key.GetHex());
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return CfdErrorCode::kCfdUnknownError;
}